

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O3

ecs_entity_t
ecs_type_contains(ecs_world_t *world,ecs_type_t type_1,ecs_type_t type_2,_Bool match_all,
                 _Bool match_prefab)

{
  uint uVar1;
  uint uVar2;
  ulong *puVar3;
  void *pvVar4;
  ecs_entity_t eVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong component;
  int iVar10;
  ecs_world_t *local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  void *local_38;
  
  local_58 = world;
  _ecs_assert(world != (ecs_world_t *)0x0,0xc,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/type.c"
              ,0x3b);
  if (world == (ecs_world_t *)0x0) {
    __assert_fail("world != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/type.c"
                  ,0x3b,
                  "ecs_entity_t ecs_type_contains(ecs_world_t *, ecs_type_t, ecs_type_t, _Bool, _Bool)"
                 );
  }
  ecs_get_stage(&local_58);
  if (type_1 == (ecs_type_t)0x0) {
LAB_00128a9e:
    uVar8 = 0;
  }
  else {
    _ecs_assert(type_2 != (ecs_type_t)0x0,0xc,(char *)0x0,"type_2 != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/type.c"
                ,0x42);
    if (type_2 == (ecs_type_t)0x0) {
      __assert_fail("type_2 != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/type.c"
                    ,0x42,
                    "ecs_entity_t ecs_type_contains(ecs_world_t *, ecs_type_t, ecs_type_t, _Bool, _Bool)"
                   );
    }
    puVar3 = (ulong *)_ecs_vector_first(type_1,8,0x10);
    if (type_1 == type_2) {
      uVar8 = *puVar3;
    }
    else {
      pvVar4 = _ecs_vector_first(type_2,8,0x10);
      _ecs_assert(puVar3 != (ulong *)0x0,0xc,(char *)0x0,"t1_array != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/type.c"
                  ,0x4d);
      if (puVar3 == (ulong *)0x0) {
        __assert_fail("t1_array != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/type.c"
                      ,0x4d,
                      "ecs_entity_t ecs_type_contains(ecs_world_t *, ecs_type_t, ecs_type_t, _Bool, _Bool)"
                     );
      }
      _ecs_assert(pvVar4 != (void *)0x0,0xc,(char *)0x0,"t2_array != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/type.c"
                  ,0x4e);
      if (pvVar4 == (void *)0x0) {
        __assert_fail("t2_array != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/type.c"
                      ,0x4e,
                      "ecs_entity_t ecs_type_contains(ecs_world_t *, ecs_type_t, ecs_type_t, _Bool, _Bool)"
                     );
      }
      uVar1 = ecs_vector_count(type_1);
      uVar2 = ecs_vector_count(type_2);
      if ((int)uVar2 < 1) {
        component = 0;
      }
      else {
        local_48 = (ulong)uVar2;
        local_50 = (long)(int)(uVar1 - 1);
        uVar8 = 0;
        iVar10 = 0;
        local_40 = (ulong)uVar1;
        local_38 = pvVar4;
        do {
          if ((int)local_40 <= iVar10) goto LAB_00128a9e;
          component = *(ulong *)((long)local_38 + uVar8 * 8);
          lVar6 = (long)iVar10;
          uVar9 = puVar3[lVar6];
          if (uVar9 < component) {
            lVar7 = 0;
            do {
              if (local_50 - lVar6 == lVar7) goto LAB_00128a9e;
              uVar9 = puVar3[lVar6 + lVar7 + 1];
              lVar7 = lVar7 + 1;
            } while (uVar9 < component);
            iVar10 = iVar10 + (int)lVar7;
          }
          if (uVar9 == component) {
            if (!match_all) {
              return component;
            }
            iVar10 = iVar10 + 1;
            if (iVar10 < (int)local_40) {
              component = puVar3[iVar10];
            }
          }
          else {
            if ((((match_prefab) && (component != 6)) && (component != 0x101)) &&
               ((component != 0x103 &&
                (eVar5 = ecs_find_entity_in_prefabs(local_58,0,type_1,component,0), eVar5 != 0)))) {
              uVar9 = component;
            }
            if (uVar9 == component) {
              if (!match_all) {
                return component;
              }
            }
            else {
              component = uVar9;
              if (match_all) goto LAB_00128a9e;
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != local_48);
      }
      uVar8 = 0;
      if (match_all) {
        uVar8 = component;
      }
    }
  }
  return uVar8;
}

Assistant:

ecs_entity_t ecs_type_contains(
    ecs_world_t *world,
    ecs_type_t type_1,
    ecs_type_t type_2,
    bool match_all,
    bool match_prefab)
{
    ecs_assert(world != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_get_stage(&world);
    
    if (!type_1) {
        return 0;
    }

    ecs_assert(type_2 != NULL, ECS_INTERNAL_ERROR, NULL);

    if (type_1 == type_2) {
        return *(ecs_vector_first(type_1, ecs_entity_t));
    }

    int32_t i_2, i_1 = 0;
    ecs_entity_t e1 = 0;
    ecs_entity_t *t1_array = ecs_vector_first(type_1, ecs_entity_t);
    ecs_entity_t *t2_array = ecs_vector_first(type_2, ecs_entity_t);

    ecs_assert(t1_array != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(t2_array != NULL, ECS_INTERNAL_ERROR, NULL);

    int32_t t1_count = ecs_vector_count(type_1);
    int32_t t2_count = ecs_vector_count(type_2);

    for (i_2 = 0; i_2 < t2_count; i_2 ++) {
        ecs_entity_t e2 = t2_array[i_2];

        if (i_1 >= t1_count) {
            return 0;
        }

        e1 = t1_array[i_1];

        if (e2 > e1) {
            do {
                i_1 ++;
                if (i_1 >= t1_count) {
                    return 0;
                }
                e1 = t1_array[i_1];
            } while (e2 > e1);
        }

        if (e1 != e2) {
            if (match_prefab && e2 != 
                ecs_typeid(EcsName) && e2 != 
                EcsPrefab && e2 != 
                EcsDisabled) 
            {
                if (ecs_find_entity_in_prefabs(world, 0, type_1, e2, 0)) {
                    e1 = e2;
                }
            }

            if (e1 != e2) {
                if (match_all) return 0;
            } else if (!match_all) {
                return e1;
            }
        } else {
            if (!match_all) return e1;
            i_1 ++;
            if (i_1 < t1_count) {
                e1 = t1_array[i_1];
            }
        }
    }

    if (match_all) {
        return e1;
    } else {
        return 0;
    }
}